

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdD3D56Blend::is_valid_val(MthdD3D56Blend *this)

{
  MthdD3D56Blend *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x54) {
    if ((((this->super_SingleMthdTest).super_MthdTest.val & 0xf) == 0) ||
       (8 < ((this->super_SingleMthdTest).super_MthdTest.val & 0xf))) {
      return false;
    }
  }
  else if (((this->super_SingleMthdTest).super_MthdTest.val & 0xf) != 0) {
    return false;
  }
  if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3e == 0) ||
     (2 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3e)) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3e == 0) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3d == 0) {
    if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x30) >> 0x3d == 0) {
      if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3d == 0) {
        if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x3d == 0) {
          if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x24) >> 0x3c == 0) ||
             (0xb < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x24) >> 0x3c)) {
            this_local._7_1_ = false;
          }
          else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x3c == 0)
                  || (0xb < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x3c
                     )) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (cls == 0x54) {
			if (extr(val, 0, 4) < 1 || extr(val, 0, 4) > 8)
				return false;
		} else {
			if (extr(val, 0, 4))
				return false;
		}
		if (extr(val, 4, 2) < 1 || extr(val, 4, 2) > 2)
			return false;
		if (!extr(val, 6, 2))
			return false;
		if (extr(val, 9, 3))
			return false;
		if (extr(val, 13, 3))
			return false;
		if (extr(val, 17, 3))
			return false;
		if (extr(val, 21, 3))
			return false;
		if (extr(val, 24, 4) < 1 || extr(val, 24, 4) > 0xb)
			return false;
		if (extr(val, 28, 4) < 1 || extr(val, 28, 4) > 0xb)
			return false;
		return true;
	}